

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweep.h
# Opt level: O1

void __thiscall
Memory::RecyclerSweep::
QueueEmptyHeapBlock<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>>
          (RecyclerSweep *this,
          HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_> *heapBucket,
          SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *heapBlock)

{
  undefined4 *puVar1;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *pSVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  undefined8 *in_FS_OFFSET;
  
  if (Js::Configuration::Global[0x2c158] == '\x01') {
    uVar5 = HeapBucket::GetBucketIndex(&heapBucket->super_HeapBucket);
    if ((HeapBucketT<Memory::SmallLeafHeapBlockT<SmallAllocationBlockAttributes>_> *)
        (heapBlock->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).heapBucket != heapBucket)
    {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                         ,0xa9,"(heapBlock->heapBucket == heapBucket)",
                         "heapBlock->heapBucket == heapBucket");
      if (!bVar4) goto LAB_00234d91;
      *puVar1 = 0;
    }
    SmallHeapBlockT<SmallAllocationBlockAttributes>::BackgroundReleasePagesSweep
              (&heapBlock->super_SmallHeapBlockT<SmallAllocationBlockAttributes>,this->recycler);
    pSVar2 = &((this->leafData).bucketData[uVar5].pendingEmptyBlockList)->
              super_SmallHeapBlockT<SmallAllocationBlockAttributes>;
    if (pSVar2 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
      if ((this->leafData).bucketData[uVar5].pendingEmptyBlockListTail !=
          (SmallLeafHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar1 = (undefined4 *)*in_FS_OFFSET;
        *puVar1 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweep.h"
                           ,0xb0,"(bucketData.pendingEmptyBlockListTail == nullptr)",
                           "bucketData.pendingEmptyBlockListTail == nullptr");
        if (!bVar4) {
LAB_00234d91:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar1 = 0;
      }
      (this->leafData).bucketData[uVar5].pendingEmptyBlockListTail = heapBlock;
      this->hasPendingEmptyBlocks = true;
    }
    (heapBlock->super_SmallHeapBlockT<SmallAllocationBlockAttributes>).next = pSVar2;
    (this->leafData).bucketData[uVar5].pendingEmptyBlockList = heapBlock;
  }
  return;
}

Assistant:

void
RecyclerSweep::QueueEmptyHeapBlock(HeapBucketT<TBlockType> const *heapBucket, TBlockType * heapBlock)
{
#if ENABLE_BACKGROUND_PAGE_FREEING
    if (CONFIG_FLAG(EnableBGFreeZero))
    {
        auto& bucketData = this->GetBucketData(heapBucket);
        Assert(heapBlock->heapBucket == heapBucket);

        heapBlock->BackgroundReleasePagesSweep(recycler);

        TBlockType * list = bucketData.pendingEmptyBlockList;
        if (list == nullptr)
        {
            Assert(bucketData.pendingEmptyBlockListTail == nullptr);
            bucketData.pendingEmptyBlockListTail = heapBlock;
            this->hasPendingEmptyBlocks = true;
        }
        heapBlock->SetNextBlock(list);
        bucketData.pendingEmptyBlockList = heapBlock;
    }
#endif
}